

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-time.c
# Opt level: O3

int coda_dayofyear_to_month_day(int year,int day_of_year,int *month,int *day_of_month)

{
  int iVar1;
  int local_20;
  int local_1c;
  
  local_1c = year;
  if (month == (int *)0x0 || day_of_month == (int *)0x0) {
    coda_set_error(-100,"date/time argument(s) are NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-time.c"
                   ,0x225);
  }
  else {
    if ((uint)day_of_year < 0x16f) {
      iVar1 = dmy_to_mjd2000(1,1,year,&local_20);
      if (iVar1 != 0) {
        return -1;
      }
      iVar1 = mjd2000_to_dmy(day_of_year + local_20 + -1,day_of_month,month,&local_1c);
      return -(uint)(iVar1 != 0);
    }
    coda_set_error(-0x68,"invalid day of year argument (%03d)",day_of_year);
  }
  return -1;
}

Assistant:

int coda_dayofyear_to_month_day(int year, int day_of_year, int *month, int *day_of_month)
{
    int mjd;

    if (month == NULL || day_of_month == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "date/time argument(s) are NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    /* check day of year value */
    if (day_of_year < 0 || day_of_year > 366)
    {
        coda_set_error(CODA_ERROR_INVALID_DATETIME, "invalid day of year argument (%03d)", day_of_year);
        return -1;
    }

    /* retrieve mjd2000 of Jan 1st of the requested year */
    if (dmy_to_mjd2000(1, 1, year, &mjd) != 0)
    {
        return -1;
    }

    /* jump to day_of_year */
    mjd += (day_of_year - 1);

    /* retrieve day/month/year for mjd2000 value */
    if (mjd2000_to_dmy(mjd, day_of_month, month, &year) != 0)
    {
        return -1;
    }

    return 0;
}